

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O3

void ihevc_itrans_16x16(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                       WORD32 i4_shift,WORD32 zero_cols)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  ulong uVar18;
  int *piVar19;
  int *piVar20;
  undefined1 in_XMM0 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  WORD32 e [8];
  WORD32 o [8];
  int local_158 [13];
  int iStack_124;
  int aiStack_120 [4];
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 auStack_88 [8];
  WORD32 eeo [2];
  WORD32 eee [2];
  int aiStack_70 [5];
  int iStack_5c;
  int aiStack_58 [2];
  WORD32 ee [4];
  
  iVar5 = 1 << ((char)i4_shift - 1U & 0x1f);
  local_b8 = (long)(src_strd * 8);
  local_c0 = (long)(src_strd * 7);
  local_c8 = (long)(src_strd * 9);
  local_d0 = (long)(src_strd * 0xb);
  local_a8 = (long)(src_strd * 3);
  local_d8 = (long)(src_strd * 0xd);
  local_b0 = (long)(src_strd * 5);
  local_e0 = (long)(src_strd * 0xf);
  local_f0 = (long)(src_strd * 6);
  local_f8 = (long)(src_strd * 10);
  local_e8 = (long)(src_strd * 2);
  _auStack_88 = pmovsxwd(in_XMM0,0x120032004b0059);
  local_98 = pmovsxwd(_auStack_88,0xffceffa7ffee004b);
  local_100 = (long)(src_strd * 0xe);
  auVar26 = pmovsxwd(in_XMM2,0x4b0012ffa70032);
  local_a0 = (long)src_strd;
  auVar27 = pmovsxwd(in_XMM3,0xffa7004bffce0012);
  local_108 = (long)(src_strd * 4);
  local_110 = (long)(src_strd * 0xc);
  auVar28 = pmovzxdq(ZEXT416((uint)i4_shift),ZEXT416((uint)i4_shift));
  local_158[0xb] = 0x53;
  local_158[10] = 0x24;
  local_158[9] = 0x40;
  local_158[8] = 0x40;
  local_158[7] = 0x24;
  local_158[6] = 0xffffffad;
  local_158[5] = 0x40;
  local_158[4] = 0xffffffc0;
  iVar4 = 0;
  auVar21 = local_98;
  do {
    if ((zero_cols & 1U) == 0) {
      iVar7 = (int)pi2_src[src_strd];
      iVar8 = (int)pi2_src[src_strd * 3];
      iVar9 = (int)pi2_src[src_strd * 5];
      iVar10 = (int)pi2_src[src_strd * 7];
      iVar11 = (int)pi2_src[src_strd * 9];
      iVar12 = (int)pi2_src[src_strd * 0xb];
      iVar13 = (int)pi2_src[src_strd * 0xd];
      iVar14 = (int)pi2_src[src_strd * 0xf];
      auVar25._4_4_ = iVar7;
      auVar25._0_4_ = iVar7;
      auVar25._8_4_ = iVar7;
      auVar25._12_4_ = iVar7;
      auVar30._4_4_ = iVar8;
      auVar30._0_4_ = iVar8;
      auVar30._8_4_ = iVar8;
      auVar30._12_4_ = iVar8;
      auVar32._4_4_ = iVar9;
      auVar32._0_4_ = iVar9;
      auVar32._8_4_ = iVar9;
      auVar32._12_4_ = iVar9;
      auVar33._4_4_ = iVar10;
      auVar33._0_4_ = iVar10;
      auVar33._8_4_ = iVar10;
      auVar33._12_4_ = iVar10;
      auVar34._4_4_ = iVar11;
      auVar34._0_4_ = iVar11;
      auVar34._8_4_ = iVar11;
      auVar34._12_4_ = iVar11;
      auVar35._4_4_ = iVar12;
      auVar35._0_4_ = iVar12;
      auVar35._8_4_ = iVar12;
      auVar35._12_4_ = iVar12;
      auVar36._4_4_ = iVar13;
      auVar36._0_4_ = iVar13;
      auVar36._8_4_ = iVar13;
      auVar36._12_4_ = iVar13;
      auVar37._4_4_ = iVar14;
      auVar37._0_4_ = iVar14;
      auVar37._8_4_ = iVar14;
      auVar37._12_4_ = iVar14;
      lVar15 = 0;
      do {
        auVar38 = pmovsxwd(in_XMM15,*(undefined8 *)(g_ai2_ihevc_trans_16[1] + lVar15));
        auVar39 = pmulld(auVar38,auVar25);
        auVar21 = pmovsxwd(auVar21,*(undefined8 *)(g_ai2_ihevc_trans_16[3] + lVar15));
        auVar21 = pmulld(auVar21,auVar30);
        auVar38._0_4_ = auVar21._0_4_ + auVar39._0_4_;
        auVar38._4_4_ = auVar21._4_4_ + auVar39._4_4_;
        auVar38._8_4_ = auVar21._8_4_ + auVar39._8_4_;
        auVar38._12_4_ = auVar21._12_4_ + auVar39._12_4_;
        auVar21 = pmovsxwd(auVar39,*(undefined8 *)(g_ai2_ihevc_trans_16[5] + lVar15));
        auVar40 = pmulld(auVar21,auVar32);
        auVar21 = pmovsxwd(in_XMM1,*(undefined8 *)(g_ai2_ihevc_trans_16[7] + lVar15));
        auVar21 = pmulld(auVar21,auVar33);
        auVar39._0_4_ = auVar21._0_4_ + auVar40._0_4_ + auVar38._0_4_;
        auVar39._4_4_ = auVar21._4_4_ + auVar40._4_4_ + auVar38._4_4_;
        auVar39._8_4_ = auVar21._8_4_ + auVar40._8_4_ + auVar38._8_4_;
        auVar39._12_4_ = auVar21._12_4_ + auVar40._12_4_ + auVar38._12_4_;
        auVar21 = pmovsxwd(auVar38,*(undefined8 *)(g_ai2_ihevc_trans_16[9] + lVar15));
        auVar21 = pmulld(auVar21,auVar34);
        auVar38 = pmovsxwd(auVar40,*(undefined8 *)(g_ai2_ihevc_trans_16[0xb] + lVar15));
        auVar38 = pmulld(auVar38,auVar35);
        in_XMM15._0_4_ = auVar38._0_4_ + auVar21._0_4_;
        in_XMM15._4_4_ = auVar38._4_4_ + auVar21._4_4_;
        in_XMM15._8_4_ = auVar38._8_4_ + auVar21._8_4_;
        in_XMM15._12_4_ = auVar38._12_4_ + auVar21._12_4_;
        auVar21 = pmovsxwd(auVar21,*(undefined8 *)(g_ai2_ihevc_trans_16[0xd] + lVar15));
        auVar38 = pmulld(auVar21,auVar36);
        auVar21._0_4_ = auVar38._0_4_ + in_XMM15._0_4_ + auVar39._0_4_;
        auVar21._4_4_ = auVar38._4_4_ + in_XMM15._4_4_ + auVar39._4_4_;
        auVar21._8_4_ = auVar38._8_4_ + in_XMM15._8_4_ + auVar39._8_4_;
        auVar21._12_4_ = auVar38._12_4_ + in_XMM15._12_4_ + auVar39._12_4_;
        auVar38 = pmovsxwd(auVar39,*(undefined8 *)(g_ai2_ihevc_trans_16[0xf] + lVar15));
        auVar38 = pmulld(auVar38,auVar37);
        in_XMM1._0_4_ = auVar38._0_4_ + auVar21._0_4_;
        in_XMM1._4_4_ = auVar38._4_4_ + auVar21._4_4_;
        in_XMM1._8_4_ = auVar38._8_4_ + auVar21._8_4_;
        in_XMM1._12_4_ = auVar38._12_4_ + auVar21._12_4_;
        *(undefined1 (*) [16])(aiStack_58 + lVar15) = in_XMM1;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 8);
      iVar8 = (int)pi2_src[src_strd * 0xe];
      iVar7 = (int)pi2_src[src_strd * 10];
      iVar10 = (int)pi2_src[src_strd * 6];
      iVar9 = (int)pi2_src[src_strd * 2];
      local_158[0] = pi2_src[src_strd * 0xc] * 0x24 + pi2_src[src_strd * 4] * 0x53;
      auVar40._4_4_ = iVar9;
      auVar40._0_4_ = iVar9;
      auVar40._8_4_ = iVar9;
      auVar40._12_4_ = iVar9;
      auVar21 = pmulld(auVar40,_auStack_88);
      auVar31._4_4_ = iVar10;
      auVar31._0_4_ = iVar10;
      auVar31._8_4_ = iVar10;
      auVar31._12_4_ = iVar10;
      auVar32 = pmulld(auVar31,local_98);
      auVar24._4_4_ = iVar7;
      auVar24._0_4_ = iVar7;
      auVar24._8_4_ = iVar7;
      auVar24._12_4_ = iVar7;
      auVar25 = pmulld(auVar24,auVar26);
      auVar29._4_4_ = iVar8;
      auVar29._0_4_ = iVar8;
      auVar29._8_4_ = iVar8;
      auVar29._12_4_ = iVar8;
      auVar30 = pmulld(auVar29,auVar27);
      iVar7 = auVar30._0_4_ + auVar25._0_4_ + auVar32._0_4_ + auVar21._0_4_;
      iVar8 = auVar30._4_4_ + auVar25._4_4_ + auVar32._4_4_ + auVar21._4_4_;
      iVar9 = auVar30._8_4_ + auVar25._8_4_ + auVar32._8_4_ + auVar21._8_4_;
      iVar10 = auVar30._12_4_ + auVar25._12_4_ + auVar32._12_4_ + auVar21._12_4_;
      local_158[2] = pi2_src[src_strd * 8] * 0x40 + *pi2_src * 0x40;
      local_158[1] = pi2_src[src_strd * 0xc] * -0x53 + pi2_src[src_strd * 4] * 0x24;
      local_158[3] = pi2_src[src_strd * 8] * -0x40 + *pi2_src * 0x40;
      lVar15 = 0;
      piVar17 = local_158;
      piVar19 = local_158 + 2;
      piVar20 = local_158 + 0xc;
      bVar3 = true;
      do {
        bVar6 = bVar3;
        uVar18 = lVar15 * 4 ^ 4;
        iVar11 = *(int *)((long)local_158 + uVar18 + 8);
        iVar12 = *(int *)((long)local_158 + uVar18);
        *piVar20 = *piVar17 + *piVar19;
        aiStack_120[lVar15] = iVar11 - iVar12;
        lVar15 = 1;
        piVar17 = local_158 + 1;
        piVar19 = local_158 + 3;
        piVar20 = &iStack_124;
        bVar3 = false;
      } while (bVar6);
      eee[0] = iVar7 + local_158[0xc];
      eee[1] = iVar8 + iStack_124;
      aiStack_70[0] = iVar9 + aiStack_120[0];
      aiStack_70[1] = iVar10 + aiStack_120[1];
      aiStack_70[2] = aiStack_120[1] - iVar10;
      aiStack_70[3] = aiStack_120[0] - iVar9;
      aiStack_70[4] = iStack_124 - iVar8;
      iStack_5c = local_158[0xc] - iVar7;
      lVar16 = 8;
      lVar15 = 0;
      do {
        lVar1 = lVar15 * 2;
        lVar2 = lVar15 * 2;
        auVar22._0_4_ =
             *(int *)((long)eee + lVar1) + iVar5 + *(int *)((long)aiStack_58 + lVar2) >> auVar28;
        auVar22._4_4_ =
             *(int *)((long)eee + lVar1 + 4) + iVar5 + *(int *)((long)ee + lVar2 + -4) >> auVar28;
        auVar22._8_4_ =
             *(int *)((long)aiStack_70 + lVar1) + iVar5 + *(int *)((long)ee + lVar2) >> auVar28;
        auVar22._12_4_ =
             *(int *)((long)aiStack_70 + lVar1 + 4) + iVar5 + *(int *)((long)ee + lVar2 + 4) >>
             auVar28;
        auVar21 = packssdw(auVar22,auVar22);
        *(long *)((long)pi2_dst + lVar15) = auVar21._0_8_;
        lVar1 = lVar16 * 2;
        lVar2 = lVar16 * 2;
        iVar7 = *(int *)((long)ee + lVar2 + -4);
        in_XMM1._4_4_ = *(int *)((long)ee + lVar2);
        in_XMM1._0_4_ = iVar7;
        in_XMM1._8_4_ = iVar7;
        in_XMM1._12_4_ = *(int *)((long)aiStack_58 + lVar2);
        auVar23._0_4_ = (*(int *)((long)aiStack_70 + lVar1 + 4) + iVar5) - iVar7 >> auVar28;
        auVar23._4_4_ =
             (*(int *)((long)aiStack_70 + lVar1) + iVar5) - *(int *)((long)ee + lVar2) >> auVar28;
        auVar23._8_4_ = (*(int *)((long)eee + lVar1 + 4) + iVar5) - iVar7 >> auVar28;
        auVar23._12_4_ =
             (*(int *)((long)eee + lVar1) + iVar5) - *(int *)((long)aiStack_58 + lVar2) >> auVar28;
        auVar21 = packssdw(auVar23,auVar23);
        *(long *)((long)pi2_dst + lVar15 + 0x10) = auVar21._0_8_;
        lVar15 = lVar15 + 8;
        lVar16 = lVar16 + -8;
      } while (lVar15 != 0x10);
    }
    else {
      pi2_dst[8] = 0;
      pi2_dst[9] = 0;
      pi2_dst[10] = 0;
      pi2_dst[0xb] = 0;
      pi2_dst[0xc] = 0;
      pi2_dst[0xd] = 0;
      pi2_dst[0xe] = 0;
      pi2_dst[0xf] = 0;
      pi2_dst[0] = 0;
      pi2_dst[1] = 0;
      pi2_dst[2] = 0;
      pi2_dst[3] = 0;
      pi2_dst[4] = 0;
      pi2_dst[5] = 0;
      pi2_dst[6] = 0;
      pi2_dst[7] = 0;
    }
    pi2_src = pi2_src + 1;
    pi2_dst = pi2_dst + dst_strd;
    zero_cols = zero_cols >> 1;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x10);
  return;
}

Assistant:

void ihevc_itrans_16x16(WORD16 *pi2_src,
                        WORD16 *pi2_dst,
                        WORD32 src_strd,
                        WORD32 dst_strd,
                        WORD32 i4_shift,
                        WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[8], o[8];
    WORD32 ee[4], eo[4];
    WORD32 eee[2], eeo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_16; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_16 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 8; k++)
            {
                o[k] = g_ai2_ihevc_trans_16[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_16[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_16[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_16[7][k]
                                                * pi2_src[7 * src_strd]
                                + g_ai2_ihevc_trans_16[9][k]
                                                * pi2_src[9 * src_strd]
                                + g_ai2_ihevc_trans_16[11][k]
                                                * pi2_src[11 * src_strd]
                                + g_ai2_ihevc_trans_16[13][k]
                                                * pi2_src[13 * src_strd]
                                + g_ai2_ihevc_trans_16[15][k]
                                                * pi2_src[15 * src_strd];
            }
            for(k = 0; k < 4; k++)
            {
                eo[k] = g_ai2_ihevc_trans_16[2][k] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_16[6][k]
                                                * pi2_src[6 * src_strd]
                                + g_ai2_ihevc_trans_16[10][k]
                                                * pi2_src[10 * src_strd]
                                + g_ai2_ihevc_trans_16[14][k]
                                                * pi2_src[14 * src_strd];
            }
            eeo[0] = g_ai2_ihevc_trans_16[4][0] * pi2_src[4 * src_strd]
                            + g_ai2_ihevc_trans_16[12][0]
                                            * pi2_src[12 * src_strd];
            eee[0] =
                            g_ai2_ihevc_trans_16[0][0] * pi2_src[0]
                                            + g_ai2_ihevc_trans_16[8][0]
                                                            * pi2_src[8
                                                                            * src_strd];
            eeo[1] = g_ai2_ihevc_trans_16[4][1] * pi2_src[4 * src_strd]
                            + g_ai2_ihevc_trans_16[12][1]
                                            * pi2_src[12 * src_strd];
            eee[1] =
                            g_ai2_ihevc_trans_16[0][1] * pi2_src[0]
                                            + g_ai2_ihevc_trans_16[8][1]
                                                            * pi2_src[8
                                                                            * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            for(k = 0; k < 2; k++)
            {
                ee[k] = eee[k] + eeo[k];
                ee[k + 2] = eee[1 - k] - eeo[1 - k];
            }
            for(k = 0; k < 4; k++)
            {
                e[k] = ee[k] + eo[k];
                e[k + 4] = ee[3 - k] - eo[3 - k];
            }
            for(k = 0; k < 8; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 8] =
                                CLIP_S16(((e[7 - k] - o[7 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}